

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.h
# Opt level: O0

bool re2::RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,int*>
               (StringPiece *text,RE2 *re,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **a,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **a_1,int **a_2)

{
  bool bVar1;
  StringPiece sp;
  Arg *in_stack_ffffffffffffff80;
  Arg local_70;
  Arg local_60;
  undefined1 local_50 [24];
  ulong local_38;
  int **local_30;
  int **a_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **a_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **a_local;
  RE2 *re_local;
  StringPiece *text_local;
  
  local_50._16_8_ = text->ptr_;
  local_38 = *(ulong *)&text->length_;
  local_30 = a_2;
  a_local_2 = (int **)a_1;
  a_local_1 = a;
  a_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)re;
  re_local = (RE2 *)text;
  Arg::Arg((Arg *)local_50,*a);
  Arg::Arg(&local_60,(string *)*a_local_2);
  Arg::Arg(&local_70,*local_30);
  sp.ptr_ = (char *)(local_38 & 0xffffffff);
  sp._8_8_ = re;
  bVar1 = Apply<bool(*)(re2::StringPiece_const&,re2::RE2_const&,re2::RE2::Arg_const*const*,int),re2::StringPiece,re2::RE2::Arg,re2::RE2::Arg,re2::RE2::Arg>
                    ((RE2 *)PartialMatchN,
                     (_func_bool_StringPiece_ptr_RE2_ptr_Arg_ptr_ptr_int *)local_50._16_8_,sp,
                     (RE2 *)local_50,&local_60,&local_70,in_stack_ffffffffffffff80);
  return bVar1;
}

Assistant:

static bool PartialMatch(const StringPiece& text, const RE2& re, A&&... a) {
    return Apply(PartialMatchN, text, re, Arg(std::forward<A>(a))...);
  }